

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBlif.c
# Opt level: O2

void Io_NtkWriteNodeInt(FILE *pFile,Abc_Obj_t *pNode,Vec_Int_t *vCover)

{
  void **ppvVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  word wVar5;
  int *piVar6;
  ushort uVar7;
  ulong uVar8;
  word (*pawVar9) [2];
  char cVar10;
  uint uVar11;
  int (*paiVar12) [10];
  long lVar13;
  ulong uVar14;
  int nVarsMin [2];
  word Cofs6 [2];
  word uTruth7 [2];
  word Cofs7 [2] [2];
  int pVars [2] [10];
  
  uVar11 = (pNode->vFanins).nSize;
  if (7 < (int)uVar11) {
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    printf("Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n",pcVar3);
    return;
  }
  fputc(10,(FILE *)pFile);
  if ((int)uVar11 < 5) {
    fwrite(".names",6,1,(FILE *)pFile);
    for (lVar13 = 0; ppvVar1 = pNode->pNtk->vObjs->pArray, lVar13 < (pNode->vFanins).nSize;
        lVar13 = lVar13 + 1) {
      pcVar3 = Abc_ObjName((Abc_Obj_t *)ppvVar1[(pNode->vFanins).pArray[lVar13]]);
      fprintf((FILE *)pFile," %s",pcVar3);
    }
    pcVar3 = Abc_ObjName((Abc_Obj_t *)ppvVar1[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar3);
    fputs((char *)(pNode->field_5).pData,(FILE *)pFile);
    return;
  }
  uVar2 = (pNode->vFanins).nSize;
  uVar8 = 0;
  uVar14 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar14 = uVar8;
  }
  for (; uVar14 != uVar8; uVar8 = uVar8 + 1) {
    pVars[1][uVar8] = (int)uVar8;
    pVars[0][uVar8] = (int)uVar8;
  }
  if (uVar11 == 7) {
    Abc_SopToTruth7((char *)(pNode->field_5).pData,7,uTruth7);
    uVar2 = If_Dec7PickBestMux(uTruth7,Cofs7[0],Cofs7[1]);
    if ((int)uVar2 < 0) {
      uVar14 = If_Dec7Perform(uTruth7,1);
LAB_002ce4ae:
      if (uVar14 != 0) {
        cVar10 = ' ';
        uVar11 = 1;
        while( true ) {
          if ((int)uVar11 < 0) break;
          uVar7 = (ushort)(uVar14 >> 0x20);
          if (uVar11 == 0) {
            uVar7 = (ushort)uVar14;
          }
          uTruth7[uVar11] = (ulong)uVar7 * 0x1000100010001;
          for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 4) {
            *(uint *)((long)pVars[uVar11] + lVar13) =
                 (uint)(uVar14 >> (cVar10 + '\x10' + (char)lVar13 & 0x3fU)) & 7;
          }
          wVar5 = If_Dec6MinimumBase((ulong)uVar7 * 0x1000100010001,pVars[uVar11],4,
                                     nVarsMin + uVar11);
          Cofs6[uVar11] = wVar5;
          fwrite(".names",6,1,(FILE *)pFile);
          for (lVar13 = 0; lVar13 < nVarsMin[uVar11]; lVar13 = lVar13 + 1) {
            if ((long)pVars[uVar11][lVar13] == 7) {
              piVar6 = (pNode->vFanouts).pArray;
              pcVar3 = " %s_cascade";
            }
            else {
              piVar6 = (pNode->vFanins).pArray + pVars[uVar11][lVar13];
              pcVar3 = " %s";
            }
            pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*piVar6]);
            fprintf((FILE *)pFile,pcVar3,pcVar4);
          }
          pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
          pcVar4 = "";
          if (uVar11 == 0) {
            pcVar4 = "_cascade";
          }
          fprintf((FILE *)pFile," %s%s\n",pcVar3,pcVar4);
          pcVar3 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,Cofs6[uVar11],
                                   nVarsMin[uVar11],vCover);
          fputs(pcVar3,(FILE *)pFile);
          cVar10 = cVar10 + -0x20;
          uVar11 = uVar11 - 1;
        }
        return;
      }
      pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      printf("Node \"%s\" is not decomposable. Writing BLIF has failed.\n",pcVar3);
      return;
    }
    If_Dec7MinimumBase(Cofs7[0],pVars[0],7,nVarsMin);
    If_Dec7MinimumBase(Cofs7[1],pVars[1],7,nVarsMin + 1);
  }
  else {
    wVar5 = Abc_SopToTruth((char *)(pNode->field_5).pData,uVar11);
    uVar2 = If_Dec6PickBestMux(wVar5,Cofs6);
    if ((int)uVar2 < 0) {
      if ((uVar11 & 0x7ffffffe) != 6) {
        __assert_fail("nVars == 6 || nVars == 7",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                      ,0x390,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
      }
      uVar14 = If_Dec6Perform(wVar5,1);
      goto LAB_002ce4ae;
    }
    Cofs6[0] = If_Dec6MinimumBase(Cofs6[0],pVars[0],uVar11,nVarsMin);
    Cofs6[1] = If_Dec6MinimumBase(Cofs6[1],pVars[1],uVar11,nVarsMin + 1);
  }
  if (4 < nVarsMin[0]) {
    __assert_fail("nVarsMin[0] < 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                  ,0x37a,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
  }
  if (nVarsMin[1] < 5) {
    fwrite(".names",6,1,(FILE *)pFile);
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanins).pArray[uVar2]]);
    fprintf((FILE *)pFile," %s",pcVar3);
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s_cascade0",pcVar3);
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s_cascade1",pcVar3);
    pcVar3 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
    fprintf((FILE *)pFile," %s\n",pcVar3);
    fwrite("1-1 1\n01- 1\n",0xc,1,(FILE *)pFile);
    paiVar12 = pVars;
    for (uVar14 = 0; uVar14 != 2; uVar14 = uVar14 + 1) {
      pawVar9 = (word (*) [2])(Cofs6 + uVar14);
      if (uVar11 == 7) {
        pawVar9 = Cofs7 + uVar14;
      }
      pcVar3 = Io_NtkDeriveSop((Mem_Flex_t *)pNode->pNtk->pManFunc,(*pawVar9)[0],nVarsMin[uVar14],
                               vCover);
      fwrite(".names",6,1,(FILE *)pFile);
      for (lVar13 = 0; lVar13 < nVarsMin[uVar14]; lVar13 = lVar13 + 1) {
        pcVar4 = Abc_ObjName((Abc_Obj_t *)
                             pNode->pNtk->vObjs->pArray
                             [(pNode->vFanins).pArray[(*paiVar12)[lVar13]]]);
        fprintf((FILE *)pFile," %s",pcVar4);
      }
      pcVar4 = Abc_ObjName((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[*(pNode->vFanouts).pArray]);
      fprintf((FILE *)pFile," %s_cascade%d\n",pcVar4,uVar14 & 0xffffffff);
      fputs(pcVar3,(FILE *)pFile);
      paiVar12 = paiVar12 + 1;
    }
    return;
  }
  __assert_fail("nVarsMin[1] < 5",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/io/ioWriteBlif.c"
                ,0x37b,"void Io_NtkWriteNodeInt(FILE *, Abc_Obj_t *, Vec_Int_t *)");
}

Assistant:

void Io_NtkWriteNodeInt( FILE * pFile, Abc_Obj_t * pNode, Vec_Int_t * vCover )
{
    Abc_Obj_t * pNet;
    int i, nVars = Abc_ObjFaninNum(pNode);
    if ( nVars > 7 )
    {
        printf( "Node \"%s\" has more than 7 inputs. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        return;
    }

    fprintf( pFile, "\n" );
    if ( nVars <= 4 )
    {
        // write the .names line
        fprintf( pFile, ".names" );
        Abc_ObjForEachFanin( pNode, pNet, i )
            fprintf( pFile, " %s", Abc_ObjName(pNet) );
        // get the output name
        fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
        // write the cubes
        fprintf( pFile, "%s", (char*)Abc_ObjData(pNode) );
    }
    else
    {
        extern int  If_Dec6PickBestMux( word t, word Cofs[2] );
        extern int  If_Dec7PickBestMux( word t[2], word c0r[2], word c1r[2] );
        extern word If_Dec6MinimumBase( word uTruth, int * pSupp, int nVarsAll, int * pnVars );
        extern void If_Dec7MinimumBase( word uTruth[2], int * pSupp, int nVarsAll, int * pnVars );
        extern word If_Dec6Perform( word t, int fDerive );
        extern word If_Dec7Perform( word t[2], int fDerive );

        char * pSop;
        word z, uTruth6 = 0, uTruth7[2], Cofs6[2], Cofs7[2][2];
        int c, iVar, nVarsMin[2], pVars[2][10];

        // collect variables
        Abc_ObjForEachFanin( pNode, pNet, i )
            pVars[0][i] = pVars[1][i] = i;

        // derive truth table
        if ( nVars == 7 )
        {
            Abc_SopToTruth7( (char*)Abc_ObjData(pNode), nVars, uTruth7 );
            iVar = If_Dec7PickBestMux( uTruth7, Cofs7[0], Cofs7[1] );
        }
        else
        {
            uTruth6 = Abc_SopToTruth( (char*)Abc_ObjData(pNode), nVars );
            iVar = If_Dec6PickBestMux( uTruth6, Cofs6 );
        }

        // perform MUX decomposition
        if ( iVar >= 0 )
        {
            if ( nVars == 7 )
            {
                If_Dec7MinimumBase( Cofs7[0], pVars[0], nVars, &nVarsMin[0] );
                If_Dec7MinimumBase( Cofs7[1], pVars[1], nVars, &nVarsMin[1] );
            }
            else
            {
                Cofs6[0] = If_Dec6MinimumBase( Cofs6[0], pVars[0], nVars, &nVarsMin[0] );
                Cofs6[1] = If_Dec6MinimumBase( Cofs6[1], pVars[1], nVars, &nVarsMin[1] );
            }
            assert( nVarsMin[0] < 5 );
            assert( nVarsMin[1] < 5 );
            // write MUX
            fprintf( pFile, ".names" );
            fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,iVar)) );
            fprintf( pFile, " %s_cascade0", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s_cascade1", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, " %s\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            fprintf( pFile, "1-1 1\n01- 1\n" );
            // write cofactors
            for ( c = 0; c < 2; c++ )
            {
                pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                    (word)(nVars == 7 ? Cofs7[c][0] : Cofs6[c]), nVarsMin[c], vCover );
                fprintf( pFile, ".names" );
                for ( i = 0; i < nVarsMin[c]; i++ )
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
                fprintf( pFile, " %s_cascade%d\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c );
                fprintf( pFile, "%s", pSop );
            }
            return;
        }
        assert( nVars == 6 || nVars == 7 );

        // try cascade decomposition
        if ( nVars == 7 )
        {
            z = If_Dec7Perform( uTruth7, 1 );
            //If_Dec7Verify( uTruth7, z );
        }
        else
        {
            z = If_Dec6Perform( uTruth6, 1 );
            //If_Dec6Verify( uTruth6, z );
        }
        if ( z == 0 )
        {
            printf( "Node \"%s\" is not decomposable. Writing BLIF has failed.\n", Abc_ObjName(Abc_ObjFanout0(pNode)) );
            return;
        }

        // derive nodes
        for ( c = 1; c >= 0; c-- )
        {
            // collect fanins
            uTruth7[c]  = ((c ? z >> 32 : z) & 0xffff);
            uTruth7[c] |= (uTruth7[c] << 16);
            uTruth7[c] |= (uTruth7[c] << 32);
            for ( i = 0; i < 4; i++ )
                pVars[c][i] = (z >> (c*32+16+4*i)) & 7;

            // minimize truth table
            Cofs6[c] = If_Dec6MinimumBase( uTruth7[c], pVars[c], 4, &nVarsMin[c] );

            // write the nodes
            fprintf( pFile, ".names" );
            for ( i = 0; i < nVarsMin[c]; i++ )
                if ( pVars[c][i] == 7 )
                    fprintf( pFile, " %s_cascade", Abc_ObjName(Abc_ObjFanout0(pNode)) );
                else
                    fprintf( pFile, " %s", Abc_ObjName(Abc_ObjFanin(pNode,pVars[c][i])) );
            fprintf( pFile, " %s%s\n", Abc_ObjName(Abc_ObjFanout0(pNode)), c? "" : "_cascade" );

            // write SOP
            pSop = Io_NtkDeriveSop( (Mem_Flex_t *)Abc_ObjNtk(pNode)->pManFunc, 
                (word)Cofs6[c], nVarsMin[c], vCover );
            fprintf( pFile, "%s", pSop );
        }
    }
}